

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.h
# Opt level: O0

char * __thiscall
NativeCodeData::AllocatorNoFixup<Js::EquivalentTypeCache>::AllocZero
          (AllocatorNoFixup<Js::EquivalentTypeCache> *this,size_t requestedBytes)

{
  bool bVar1;
  char *data;
  JITManager *this_00;
  DataChunk *pDVar2;
  char *pcVar3;
  DataChunk *chunk;
  char *dataBlock;
  size_t requestedBytes_local;
  AllocatorNoFixup<Js::EquivalentTypeCache> *this_local;
  
  data = NativeCodeData::Allocator::AllocZero(&this->super_Allocator,requestedBytes);
  this_00 = JITManager::GetJITManager();
  bVar1 = JITManager::IsJITServer(this_00);
  if (bVar1) {
    pDVar2 = GetDataChunk(data);
    pcVar3 = std::type_info::name((type_info *)&Js::EquivalentTypeCache::typeinfo);
    pDVar2->dataType = pcVar3;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
    if (bVar1) {
      Output::Print(L"NativeCodeData AllocNoFix: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"
                    ,pDVar2,data,(ulong)pDVar2->allocIndex,(ulong)pDVar2->len,(ulong)pDVar2->offset,
                    pDVar2->dataType);
    }
  }
  return data;
}

Assistant:

char * AllocZero(size_t requestedBytes)
        {
            char* dataBlock = __super::AllocZero(requestedBytes);

#if DBG
            if (JITManager::GetJITManager()->IsJITServer())
            {
                DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                chunk->dataType = typeid(T).name();
                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData AllocNoFix: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                        chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                }
            }
#endif

            return dataBlock;
        }